

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlExpandEntitiesInAttValue(xmlParserCtxtPtr ctxt,xmlChar *str,int normalize)

{
  xmlChar *pxVar1;
  int local_3c;
  undefined1 local_38 [4];
  int inSpace;
  xmlSBuf buf;
  uint maxLength;
  int normalize_local;
  xmlChar *str_local;
  xmlParserCtxtPtr ctxt_local;
  
  buf.max = 10000000;
  if ((ctxt->options & 0x80000U) != 0) {
    buf.max = 1000000000;
  }
  local_3c = 1;
  buf.code = normalize;
  xmlSBufInit((xmlSBuf *)local_38,buf.max);
  xmlExpandEntityInAttValue
            (ctxt,(xmlSBuf *)local_38,str,(xmlEntityPtr)0x0,buf.code,&local_3c,ctxt->inputNr,0);
  if (((buf.code != XML_ERR_OK) && (local_3c != 0)) && ((int)buf.mem != 0)) {
    buf.mem._0_4_ = (int)buf.mem + -1;
  }
  pxVar1 = xmlSBufFinish((xmlSBuf *)local_38,(int *)0x0,ctxt,"AttValue length too long");
  return pxVar1;
}

Assistant:

xmlChar *
xmlExpandEntitiesInAttValue(xmlParserCtxtPtr ctxt, const xmlChar *str,
                            int normalize) {
    unsigned maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                         XML_MAX_HUGE_LENGTH :
                         XML_MAX_TEXT_LENGTH;
    xmlSBuf buf;
    int inSpace = 1;

    xmlSBufInit(&buf, maxLength);

    xmlExpandEntityInAttValue(ctxt, &buf, str, NULL, normalize, &inSpace,
                              ctxt->inputNr, /* check */ 0);

    if ((normalize) && (inSpace) && (buf.size > 0))
        buf.size--;

    return(xmlSBufFinish(&buf, NULL, ctxt, "AttValue length too long"));
}